

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall
Minisat::
OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
::clean(OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
        *this,int *idx)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  char *__function;
  long lVar4;
  int iVar5;
  vec<unsigned_int,_int> *pvVar6;
  long lVar7;
  long lVar8;
  
  iVar5 = *idx;
  if (iVar5 < (this->occs).map.sz) {
    pvVar6 = (this->occs).map.data;
    iVar1 = pvVar6[iVar5].sz;
    if (iVar1 < 1) {
      if (iVar1 < 0) goto LAB_001127a5;
    }
    else {
      pvVar6 = pvVar6 + iVar5;
      lVar8 = 0;
      lVar7 = 0;
      iVar5 = 0;
      do {
        bVar2 = SimpSolver::ClauseDeleted::operator()
                          (&this->deleted,(CRef *)((long)pvVar6->data + lVar8));
        if (!bVar2) {
          lVar4 = (long)iVar5;
          iVar5 = iVar5 + 1;
          pvVar6->data[lVar4] = *(uint *)((long)pvVar6->data + lVar8);
        }
        lVar7 = lVar7 + 1;
        iVar1 = pvVar6->sz;
        lVar8 = lVar8 + 4;
      } while (lVar7 < iVar1);
      iVar3 = (int)lVar7 - iVar5;
      if (iVar1 < iVar3) {
LAB_001127a5:
        __assert_fail("nelems <= sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Vec.h"
                      ,0x41,
                      "void Minisat::vec<unsigned int>::shrink(Size) [T = unsigned int, _Size = int]"
                     );
      }
      if (0 < iVar3) {
        pvVar6->sz = (iVar5 + iVar1) - (int)lVar7;
      }
    }
    if (*idx < (this->dirty).map.sz) {
      (this->dirty).map.data[*idx] = '\0';
      return;
    }
    __function = 
    "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
    ;
  }
  else {
    __function = 
    "V &Minisat::IntMap<int, Minisat::vec<unsigned int>>::operator[](K) [K = int, V = Minisat::vec<unsigned int>, MkIndex = Minisat::MkIndexDefault<int>]"
    ;
  }
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,__function);
}

Assistant:

void OccLists<K,Vec,Deleted,MkIndex>::clean(const K& idx)
{
    Vec& vec = occs[idx];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[idx] = 0;
}